

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O0

void __thiscall
lunasvg::SVGClipPathElement::applyClipMask(SVGClipPathElement *this,SVGRenderState *state)

{
  float tx;
  float ty;
  __shared_count<(__gnu_cxx::_Lock_policy)2> parent;
  bool bVar1;
  Units UVar2;
  Transform *pTVar3;
  SVGClipPathElement *pSVar4;
  Canvas *this_00;
  element_type *canvas;
  Rect RVar5;
  shared_ptr<lunasvg::Canvas> local_e8;
  undefined1 local_d8 [8];
  SVGRenderState newState;
  float fStack_90;
  Rect bbox;
  undefined1 local_60 [8];
  Transform currentTransform;
  Rect local_38;
  undefined1 local_28 [8];
  shared_ptr<lunasvg::Canvas> maskImage;
  SVGRenderState *state_local;
  SVGClipPathElement *this_local;
  
  maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)state;
  bVar1 = SVGRenderState::hasCycleReference(state,(SVGElement *)this);
  if (!bVar1) {
    pTVar3 = SVGRenderState::currentTransform
                       ((SVGRenderState *)
                        maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
    RVar5 = SVGRenderState::paintBoundingBox
                      ((SVGRenderState *)
                       maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
    currentTransform.m_matrix._16_8_ = RVar5._0_8_;
    RVar5 = Transform::mapRect(pTVar3,(Rect *)&currentTransform.m_matrix.e);
    local_38._0_8_ = RVar5._0_8_;
    local_38._8_8_ = RVar5._8_8_;
    Canvas::create((Canvas *)local_28,&local_38);
    pTVar3 = SVGRenderState::currentTransform
                       ((SVGRenderState *)
                        maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
    SVGGraphicsElement::localTransform((Transform *)&bbox.w,&this->super_SVGGraphicsElement);
    Transform::operator*((Transform *)local_60,pTVar3,(Transform *)&bbox.w);
    UVar2 = SVGEnumeration<lunasvg::Units>::value(&this->m_clipPathUnits);
    if (UVar2 == ObjectBoundingBox) {
      RVar5 = SVGRenderState::fillBoundingBox
                        ((SVGRenderState *)
                         maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
      bbox._0_8_ = RVar5._8_8_;
      newState.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = RVar5.x;
      tx = newState.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._4_4_;
      fStack_90 = RVar5.y;
      ty = fStack_90;
      unique0x10000374 = RVar5._0_8_;
      Transform::translate((Transform *)local_60,tx,ty);
      Transform::scale((Transform *)local_60,bbox.x,bbox.y);
    }
    parent._M_pi = maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    std::shared_ptr<lunasvg::Canvas>::shared_ptr(&local_e8,(shared_ptr<lunasvg::Canvas> *)local_28);
    SVGRenderState::SVGRenderState
              ((SVGRenderState *)local_d8,(SVGElement *)this,(SVGRenderState *)parent._M_pi,
               (Transform *)local_60,Clipping,&local_e8);
    std::shared_ptr<lunasvg::Canvas>::~shared_ptr(&local_e8);
    SVGElement::renderChildren((SVGElement *)this,(SVGRenderState *)local_d8);
    pSVar4 = SVGElement::clipper((SVGElement *)this);
    if (pSVar4 != (SVGClipPathElement *)0x0) {
      pSVar4 = SVGElement::clipper((SVGElement *)this);
      applyClipMask(pSVar4,(SVGRenderState *)local_d8);
    }
    this_00 = SVGRenderState::operator->
                        ((SVGRenderState *)
                         maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
    canvas = std::__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_28);
    Canvas::blendCanvas(this_00,canvas,Dst_In,1.0);
    SVGRenderState::~SVGRenderState((SVGRenderState *)local_d8);
    std::shared_ptr<lunasvg::Canvas>::~shared_ptr((shared_ptr<lunasvg::Canvas> *)local_28);
  }
  return;
}

Assistant:

void SVGClipPathElement::applyClipMask(SVGRenderState& state) const
{
    if(state.hasCycleReference(this))
        return;
    auto maskImage = Canvas::create(state.currentTransform().mapRect(state.paintBoundingBox()));
    auto currentTransform = state.currentTransform() * localTransform();
    if(m_clipPathUnits.value() == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        currentTransform.translate(bbox.x, bbox.y);
        currentTransform.scale(bbox.w, bbox.h);
    }

    SVGRenderState newState(this, &state, currentTransform, SVGRenderMode::Clipping, maskImage);
    renderChildren(newState);
    if(clipper()) {
        clipper()->applyClipMask(newState);
    }

    state->blendCanvas(*maskImage, BlendMode::Dst_In, 1.f);
}